

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InvocationReadWriteCase::
genShaderMainBlock_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  string *psVar1;
  ostream *poVar2;
  int ndx;
  int iVar3;
  char *pcVar4;
  int local_28c;
  int local_280;
  int local_27c;
  ulong local_278;
  string *local_270;
  string localID;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream buf;
  
  local_270 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  local_28c = 0;
  local_278 = 1;
  while( true ) {
    iVar3 = (int)local_278 + -1;
    if (*(int *)((long)this + 0x90) <= iVar3) break;
    if (*(char *)((long)this + 0x7e) == '\x01') {
      local_27c = (int)local_278;
      de::toString<int>(&local_208,&local_27c);
      std::operator+(&local_1e8,"(gl_LocalInvocationID.xy + uvec2(",&local_208);
      std::operator+(&local_248,&local_1e8,", ");
      local_280 = local_28c;
      de::toString<int>(&local_228,&local_280);
      std::operator+(&local_1c8,&local_248,&local_228);
      std::operator+(&localID,&local_1c8,")) % gl_WorkGroupSize.xy");
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&localID,"gl_LocalInvocationID.xy",(allocator<char> *)&local_1c8);
    }
    if (*(int *)((long)this + 0x78) == 1) {
      if (*(char *)((long)this + 0x7c) == '\x01') {
        poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(");
        poVar2 = std::operator<<(poVar2,(string *)&localID);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        pcVar4 = "), 123) == 0);\n";
      }
      else {
        poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\tallOk = allOk && (imageLoad(u_image, getCoord(");
        poVar2 = std::operator<<(poVar2,(string *)&localID);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        pcVar4 = ")).x == 0);\n";
      }
LAB_01288b75:
      std::operator<<(poVar2,pcVar4);
    }
    else if (*(int *)((long)this + 0x78) == 0) {
      if (*(char *)((long)this + 0x7c) == '\x01') {
        poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(");
        poVar2 = std::operator<<(poVar2,(string *)&localID);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        pcVar4 = ")], 123) == 0);\n";
      }
      else {
        poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\tallOk = allOk && (sb_store.values[getIndex(");
        poVar2 = std::operator<<(poVar2,(string *)&localID);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        pcVar4 = ")] == 0);\n";
      }
      goto LAB_01288b75;
    }
    std::__cxx11::string::~string((string *)&localID);
    local_28c = local_28c + 2;
    local_278 = (ulong)((int)local_278 + 1);
  }
  InterInvocationTestCase::genBarrierSource_abi_cxx11_(&localID,this);
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,(string *)&localID);
  std::__cxx11::string::~string((string *)&localID);
  iVar3 = 0;
  do {
    psVar1 = local_270;
    if (*(int *)((long)this + 0x90) <= iVar3) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      return psVar1;
    }
    if (*(int *)((long)this + 0x78) == 1) {
      if (*(char *)((long)this + 0x7c) == '\x01') {
        poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        pcVar4 = "), int(groupNdx));\n";
      }
      else {
        poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        pcVar4 = "), ivec4(int(groupNdx), 0, 0, 0));\n";
      }
LAB_01288c87:
      std::operator<<(poVar2,pcVar4);
    }
    else if (*(int *)((long)this + 0x78) == 0) {
      if (*(char *)((long)this + 0x7c) == '\x01') {
        poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        pcVar4 = ")], groupNdx);\n";
      }
      else {
        poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\tsb_store.values[getIndex(gl_LocalInvocationID.xy, ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
        pcVar4 = ")] = groupNdx;\n";
      }
      goto LAB_01288c87;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

std::string InvocationReadWriteCase::genShaderMainBlock (void) const
{
	std::ostringstream buf;

	// read

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		const std::string localID = (m_syncWithGroup) ? ("(gl_LocalInvocationID.xy + uvec2(" + de::toString(ndx+1) + ", " + de::toString(2*ndx) + ")) % gl_WorkGroupSize.xy") : ("gl_LocalInvocationID.xy");

		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(" << localID << ", " << ndx << ")], 123) == 0);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tallOk = allOk && (sb_store.values[getIndex(" << localID << ", " << ndx << ")] == 0);\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(" << localID << ", " << ndx << "), 123) == 0);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\tallOk = allOk && (imageLoad(u_image, getCoord(" << localID << ", " << ndx << ")).x == 0);\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	// barrier

	buf << genBarrierSource();

	// write

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")], groupNdx);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tsb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")] = groupNdx;\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), int(groupNdx));\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), ivec4(int(groupNdx), 0, 0, 0));\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	return buf.str();
}